

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vmhraddshs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  bVar1 = false;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    iVar4 = ((int)b->s16[lVar2] * (int)a->s16[lVar2] + 0x4000 >> 0xf) + (int)c->s16[lVar2];
    iVar3 = 0x7fff;
    if (iVar4 < 0x7fff) {
      iVar3 = iVar4;
    }
    if ((short)iVar4 != iVar4) {
      bVar1 = true;
    }
    if (iVar3 < -0x7fff) {
      iVar3 = -0x8000;
    }
    r->u16[lVar2] = (uint16_t)iVar3;
  }
  if (bVar1) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

void helper_vmhraddshs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                       ppc_avr_t *b, ppc_avr_t *c)
{
    int sat = 0;
    int i;

    for (i = 0; i < ARRAY_SIZE(r->s16); i++) {
        int32_t prod = a->s16[i] * b->s16[i] + 0x00004000;
        int32_t t = (int32_t)c->s16[i] + (prod >> 15);
        r->s16[i] = cvtswsh(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}